

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_diff_values.h
# Opt level: O0

string * __thiscall
cute::diff_values<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
          (string *__return_storage_ptr__,cute *this,_CM_RETURN_STATUS *expected,
          _CM_RETURN_STATUS *actual,char *left,char *right)

{
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_31;
  char *local_30;
  char *right_local;
  char *left_local;
  _CM_RETURN_STATUS *actual_local;
  _CM_RETURN_STATUS *expected_local;
  string *res;
  
  local_31 = 0;
  local_30 = left;
  right_local = (char *)actual;
  left_local = (char *)expected;
  actual_local = (_CM_RETURN_STATUS *)this;
  expected_local = (_CM_RETURN_STATUS *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,right_local);
  cute_to_string::to_string<_CM_RETURN_STATUS>(&local_c8,actual_local);
  cute_to_string::backslashQuoteTabNewline(&local_a8,&local_c8);
  std::operator+(&local_88,":\t",&local_a8);
  std::operator+(&local_68,&local_88,'\t');
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_30);
  cute_to_string::to_string<_CM_RETURN_STATUS>(&local_148,(_CM_RETURN_STATUS *)left_local);
  cute_to_string::backslashQuoteTabNewline(&local_128,&local_148);
  std::operator+(&local_108,":\t",&local_128);
  std::operator+(&local_e8,&local_108,'\t');
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  return __return_storage_ptr__;
}

Assistant:

std::string diff_values(ExpectedValue const &expected
						, ActualValue const & actual
						, char const *left="expected"
						, char const *right="but was"){
		// construct a simple message...to be parsed by IDE support
		std::string res;
		res += ' ';
		res += left;
		res+=":\t" + cute_to_string::backslashQuoteTabNewline(cute_to_string::to_string(expected))+'\t';
		res += right;
		res +=":\t"+cute_to_string::backslashQuoteTabNewline(cute_to_string::to_string(actual))+'\t';
		return res;
	}